

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.hpp
# Opt level: O2

bool __thiscall
gl4cts::ShaderSubroutine::Utils::vec4<unsigned_int>::operator==
          (vec4<unsigned_int> *this,vec4<unsigned_int> *val)

{
  undefined1 auVar1 [16];
  
  auVar1[0] = -((char)this->m_x == (char)val->m_x);
  auVar1[1] = -(*(char *)((long)&this->m_x + 1) == *(char *)((long)&val->m_x + 1));
  auVar1[2] = -(*(char *)((long)&this->m_x + 2) == *(char *)((long)&val->m_x + 2));
  auVar1[3] = -(*(char *)((long)&this->m_x + 3) == *(char *)((long)&val->m_x + 3));
  auVar1[4] = -((char)this->m_y == (char)val->m_y);
  auVar1[5] = -(*(char *)((long)&this->m_y + 1) == *(char *)((long)&val->m_y + 1));
  auVar1[6] = -(*(char *)((long)&this->m_y + 2) == *(char *)((long)&val->m_y + 2));
  auVar1[7] = -(*(char *)((long)&this->m_y + 3) == *(char *)((long)&val->m_y + 3));
  auVar1[8] = -((char)this->m_z == (char)val->m_z);
  auVar1[9] = -(*(char *)((long)&this->m_z + 1) == *(char *)((long)&val->m_z + 1));
  auVar1[10] = -(*(char *)((long)&this->m_z + 2) == *(char *)((long)&val->m_z + 2));
  auVar1[0xb] = -(*(char *)((long)&this->m_z + 3) == *(char *)((long)&val->m_z + 3));
  auVar1[0xc] = -((char)this->m_w == (char)val->m_w);
  auVar1[0xd] = -(*(char *)((long)&this->m_w + 1) == *(char *)((long)&val->m_w + 1));
  auVar1[0xe] = -(*(char *)((long)&this->m_w + 2) == *(char *)((long)&val->m_w + 2));
  auVar1[0xf] = -(*(char *)((long)&this->m_w + 3) == *(char *)((long)&val->m_w + 3));
  return (ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe | (ushort)(auVar1[0xf] >> 7) << 0xf)
         == 0xffff;
}

Assistant:

bool operator==(const vec4& val) const
		{
			bool result = true;

			result = result && compare(m_x, val.m_x);
			result = result && compare(m_y, val.m_y);
			result = result && compare(m_z, val.m_z);
			result = result && compare(m_w, val.m_w);

			return result;
		}